

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O1

SharedPtr<Decorator> __thiscall
Rml::DecoratorRadialGradientInstancer::InstanceDecorator
          (DecoratorRadialGradientInstancer *this,String *name,PropertyDictionary *properties_,
          DecoratorInstancerInterface *param_3)

{
  Array<const_Property_*,_2> p_position;
  long lVar1;
  int iVar2;
  Property *this_00;
  Property *this_01;
  Property *this_02;
  Property *pPVar3;
  NumericValue NVar4;
  bool bVar5;
  undefined8 extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  uint uVar7;
  Vector2Numeric VVar8;
  SharedPtr<Decorator> SVar9;
  SharedPtr<Rml::DecoratorRadialGradient> decorator;
  undefined1 local_71;
  Property *local_70;
  Property *local_68;
  uint uVar10;
  uint uVar11;
  int iVar12;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 uVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  NumericValue local_48;
  Property *local_40;
  PropertyDictionary *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  local_38 = properties_;
  this_00 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[8]);
  this_01 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[9]);
  this_02 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[10]);
  pPVar3 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xb]);
  local_70 = PropertyDictionary::GetProperty
                       ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xc]);
  local_68 = PropertyDictionary::GetProperty
                       ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xd]);
  bVar5 = (pPVar3 == (Property *)0x0 || this_02 == (Property *)0x0) ||
          (this_01 == (Property *)0x0 || this_00 == (Property *)0x0);
  _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar5);
  if ((bVar5) || (local_70 == (Property *)0x0 || local_68 == (Property *)0x0)) {
    (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
    (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    uVar10 = 0;
    local_40 = pPVar3;
    Variant::GetInto<int,_0>(&this_00->value,(int *)&stack0xffffffffffffffa8);
    uVar7 = uVar10;
    if (uVar10 == 2) {
      if ((this_01->unit & LENGTH_PERCENT) == UNKNOWN) {
        uVar7 = 1;
      }
      else {
        uVar7 = (uint)(this_02->unit != KEYWORD);
      }
    }
    if ((uVar7 != 0) ||
       ((_Var6._M_pi = extraout_RDX_00, this_01->unit != PERCENT && (this_02->unit == KEYWORD)))) {
      if (this_01->unit == KEYWORD) {
        uVar11 = 0;
        Variant::GetInto<int,_0>(&this_01->value,(int *)&stack0xffffffffffffffa8);
        local_48.number = 0.0;
        local_48.unit = UNKNOWN;
        NVar4.number = 0.0;
        NVar4.unit = UNKNOWN;
        uVar10 = uVar11;
      }
      else {
        NVar4 = Property::GetNumericValue(this_01);
        uVar11 = 4;
        local_48 = NVar4;
        if (this_02->unit != KEYWORD) {
          local_48 = Property::GetNumericValue(this_02);
        }
      }
      p_position._M_elems[1]._0_4_ = uVar10;
      p_position._M_elems[0] = (Property *)this;
      p_position._M_elems[1]._4_4_ = in_stack_ffffffffffffffac;
      VVar8 = ComputePosition(p_position);
      iVar2 = ::std::__cxx11::string::compare((char *)local_38);
      _Var6._M_pi = extraout_RDX_01;
      if (local_68->unit == COLORSTOPLIST) {
        local_70 = (Property *)CONCAT44(local_70._4_4_,uVar11);
        local_68 = (Property *)(local_68->value).data;
        iVar12 = 0;
        uVar13 = 0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<Rml::DecoratorRadialGradient,std::allocator<Rml::DecoratorRadialGradient>>
                  (&local_50,(DecoratorRadialGradient **)&stack0xffffffffffffffa8,
                   (allocator<Rml::DecoratorRadialGradient> *)&local_71);
        lVar1 = CONCAT44(uVar13,iVar12);
        *(bool *)(lVar1 + 0x30) = iVar2 == 0;
        *(uint *)(lVar1 + 0x34) = uVar7;
        *(undefined4 *)(lVar1 + 0x38) = local_70._0_4_;
        *(NumericValue *)(lVar1 + 0x3c) = NVar4;
        *(NumericValue *)(lVar1 + 0x44) = local_48;
        *(Vector2Numeric *)(lVar1 + 0x4c) = VVar8;
        ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::operator=
                  ((vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_> *)(lVar1 + 0x60),
                   (vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_> *)local_68);
        _Var6._M_pi = local_50._M_pi;
        if (*(long *)(lVar1 + 0x60) == *(long *)(lVar1 + 0x68)) {
          (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
          (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
          super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        }
        else {
          (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
               (_func_int **)CONCAT44(uVar13,iVar12);
          (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
          super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
          super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var6._M_pi;
        }
        _Var6._M_pi = extraout_RDX_02;
        if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
          _Var6._M_pi = extraout_RDX_03;
        }
        goto LAB_0020bee9;
      }
    }
    (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
    (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
LAB_0020bee9:
  SVar9.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  SVar9.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar9.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorRadialGradientInstancer::InstanceDecorator(const String& name, const PropertyDictionary& properties_,
	const DecoratorInstancerInterface& /*interface_*/)
{
	const Property* p_ending_shape = properties_.GetProperty(ids.ending_shape);
	const Property* p_size_x = properties_.GetProperty(ids.size_x);
	const Property* p_size_y = properties_.GetProperty(ids.size_y);
	Array<const Property*, 2> p_position = {properties_.GetProperty(ids.position_x), properties_.GetProperty(ids.position_y)};
	const Property* p_color_stop_list = properties_.GetProperty(ids.color_stop_list);

	if (!p_ending_shape || !p_size_x || !p_size_y || !p_position[0] || !p_position[1] || !p_color_stop_list)
		return nullptr;

	using SizeType = DecoratorRadialGradient::SizeType;
	using Shape = DecoratorRadialGradient::Shape;

	Shape shape = (Shape)p_ending_shape->Get<int>();
	if (shape == Shape::Unspecified)
	{
		const bool circle_sized = (Any(p_size_x->unit & Unit::LENGTH_PERCENT) && p_size_y->unit == Unit::KEYWORD);
		shape = (circle_sized ? Shape::Circle : Shape::Ellipse);
	}
	if (shape == Shape::Circle && (p_size_x->unit == Unit::PERCENT || p_size_y->unit != Unit::KEYWORD))
		return nullptr;

	SizeType size_type = {};
	Vector2Numeric size;
	if (p_size_x->unit == Unit::KEYWORD)
	{
		size_type = (SizeType)p_size_x->Get<int>();
	}
	else
	{
		size_type = SizeType::LengthPercentage;
		size.x = p_size_x->GetNumericValue();
		size.y = (p_size_y->unit == Unit::KEYWORD ? size.x : p_size_y->GetNumericValue());
	}

	const Vector2Numeric position = ComputePosition(p_position);
	const bool repeating = (name == "repeating-radial-gradient");

	if (p_color_stop_list->unit != Unit::COLORSTOPLIST)
		return nullptr;
	const ColorStopList& color_stop_list = p_color_stop_list->value.GetReference<ColorStopList>();

	auto decorator = MakeShared<DecoratorRadialGradient>();
	if (decorator->Initialise(repeating, shape, size_type, size, position, color_stop_list))
		return decorator;

	return nullptr;
}